

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O0

double S2::GetArea(S2Shape *shape)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  S2LogMessage local_78;
  S2LogMessageVoidify local_61;
  S2PointSpan local_60;
  int local_50;
  int chain_id;
  int local_3c;
  undefined1 local_38 [4];
  int num_chains;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  double area;
  S2Shape *shape_local;
  
  iVar2 = (*shape->_vptr_S2Shape[4])();
  if (iVar2 == 2) {
    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
    local_3c = (*shape->_vptr_S2Shape[6])();
    for (local_50 = 0; local_50 < local_3c; local_50 = local_50 + 1) {
      GetChainVertices(shape,local_50,
                       (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
      S2PointLoopSpan::
      Span<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,void,std::vector>
                ((S2PointLoopSpan *)&local_60,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
      dVar1 = GetSignedArea((S2PointLoopSpan)local_60);
      vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(dVar1 + (double)vertices.
                                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (12.566370614359172 <
        ABS((double)vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_measures.cc"
                 ,0x4e,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_78);
      poVar3 = std::operator<<(poVar3,"Check failed: (fabs(area)) <= (4 * 3.14159265358979323846) ")
      ;
      S2LogMessageVoidify::operator&(&local_61,poVar3);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
    }
    if ((double)vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage < 0.0) {
      vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((double)vertices.
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 12.566370614359172)
      ;
    }
    shape_local = (S2Shape *)
                  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
  }
  else {
    shape_local = (S2Shape *)0x0;
  }
  return (double)shape_local;
}

Assistant:

double GetArea(const S2Shape& shape) {
  if (shape.dimension() != 2) return 0.0;

  // Since S2Shape uses the convention that the interior of the shape is to
  // the left of all edges, in theory we could compute the area of the polygon
  // by simply adding up all the loop areas modulo 4*Pi.  The problem with
  // this approach is that polygons holes typically have areas near 4*Pi,
  // which can create large cancellation errors when computing the area of
  // small polygons with holes.  For example, a shell with an area of 4 square
  // meters (1e-13 steradians) surrounding a hole with an area of 3 square
  // meters (7.5e-14 sterians) would lose almost all of its accuracy if the
  // area of the hole was computed as 12.566370614359098.
  //
  // So instead we use S2::GetSignedArea() to ensure that all loops have areas
  // in the range [-2*Pi, 2*Pi].
  double area = 0;
  vector<S2Point> vertices;
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    GetChainVertices(shape, chain_id, &vertices);
    area += S2::GetSignedArea(S2PointLoopSpan(vertices));
  }
  // Note that S2::GetSignedArea() guarantees that the full loop (containing
  // all points on the sphere) has a very small negative area.
  S2_DCHECK_LE(fabs(area), 4 * M_PI);
  if (area < 0.0) area += 4 * M_PI;
  return area;
}